

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>::dx
          (value_type *__return_storage_ptr__,
          FadBinaryMul<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>
          *this,int i)

{
  value_type local_50;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> local_30;
  
  FadBinaryMinus<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::dx(&local_50,&this->left_->fadexpr_,i);
  local_30.fadexpr_.right_.constant_ = (this->right_).constant_;
  local_30.fadexpr_.right_.defaultVal = 0.0;
  local_30.fadexpr_.left_ = &local_50;
  Fad<double>::Fad<FadBinaryMul<Fad<double>,FadCst<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val();}